

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestCaseGroup * vkt::api::createCommandBuffersTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> commandBuffersTests;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"command_buffers","Command Buffers Tests");
  commandBuffersTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"pool_create_null_params",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::createPoolNullParamsTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"pool_create_non_null_allocator",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::createPoolNonNullAllocatorTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"pool_create_transient_bit",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::createPoolTransientBitTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"pool_create_reset_bit",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::createPoolResetBitTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"pool_reset_release_res",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::resetPoolReleaseResourcesBitTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"pool_reset_no_flags_res",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::resetPoolNoFlagsTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"pool_reset_reuse",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::resetPoolReuseTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"allocate_single_primary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::allocatePrimaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"allocate_many_primary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::allocateManyPrimaryBuffersTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"allocate_single_secondary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::allocateSecondaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"allocate_many_secondary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::allocateManySecondaryBuffersTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"execute_small_primary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::executePrimaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"execute_large_primary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::executeLargePrimaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"reset_implicit",&local_61)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::resetBufferImplicitlyTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"trim_command_pool",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase<vk::VkCommandBufferLevel>
            (pTVar1,&local_40,&local_60,anon_unknown_0::trimCommandPoolTest,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"trim_command_pool_secondary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase<vk::VkCommandBufferLevel>
            (pTVar1,&local_40,&local_60,anon_unknown_0::trimCommandPoolTest,
             VK_COMMAND_BUFFER_LEVEL_SECONDARY);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"record_single_primary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::recordSinglePrimaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"record_many_primary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::recordLargePrimaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"record_single_secondary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::recordSingleSecondaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"record_many_secondary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::recordLargeSecondaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"submit_twice_primary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::submitPrimaryBufferTwiceTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"submit_twice_secondary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::submitSecondaryBufferTwiceTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"record_one_time_submit_primary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::oneTimeSubmitFlagPrimaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"record_one_time_submit_secondary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::oneTimeSubmitFlagSecondaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"render_pass_continue",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::renderPassContinueTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"record_simul_use_primary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::simultaneousUsePrimaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"record_simul_use_secondary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::simultaneousUseSecondaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"record_simul_use_secondary_one_primary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCaseWithPrograms
            (pTVar1,&local_40,&local_60,anon_unknown_0::genComputeIncrementSource,
             anon_unknown_0::simultaneousUseSecondaryBufferOnePrimaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"record_simul_use_secondary_two_primary",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCaseWithPrograms
            (pTVar1,&local_40,&local_60,anon_unknown_0::genComputeIncrementSource,
             anon_unknown_0::simultaneousUseSecondaryBufferTwoPrimaryBuffersTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"record_query_precise_w_flag",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::recordBufferQueryPreciseWithFlagTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"record_query_imprecise_w_flag",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::recordBufferQueryImpreciseWithFlagTest)
  ;
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"record_query_imprecise_wo_flag",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,
                  anon_unknown_0::recordBufferQueryImpreciseWithoutFlagTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"submit_count_non_zero",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::submitBufferCountNonZero);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"submit_count_equal_zero",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::submitBufferCountEqualZero);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"submit_wait_single_semaphore",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::submitBufferWaitSingleSemaphore);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"submit_wait_many_semaphores",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::submitBufferWaitManySemaphores);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"submit_null_fence",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::submitBufferNullFence);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"secondary_execute",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::executeSecondaryBufferTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"secondary_execute_twice",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::executeSecondaryBufferTwiceTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"order_bind_pipeline",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCaseWithPrograms
            (pTVar1,&local_40,&local_60,anon_unknown_0::genComputeSource,
             anon_unknown_0::orderBindPipelineTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = commandBuffersTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  commandBuffersTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&commandBuffersTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createCommandBuffersTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	commandBuffersTests	(new tcu::TestCaseGroup(testCtx, "command_buffers", "Command Buffers Tests"));

	/* 19.1. Command Pools (5.1 in VK 1.0 Spec) */
	addFunctionCase				(commandBuffersTests.get(), "pool_create_null_params",			"",	createPoolNullParamsTest);
	addFunctionCase				(commandBuffersTests.get(), "pool_create_non_null_allocator",	"",	createPoolNonNullAllocatorTest);
	addFunctionCase				(commandBuffersTests.get(), "pool_create_transient_bit",		"",	createPoolTransientBitTest);
	addFunctionCase				(commandBuffersTests.get(), "pool_create_reset_bit",			"",	createPoolResetBitTest);
	addFunctionCase				(commandBuffersTests.get(), "pool_reset_release_res",			"",	resetPoolReleaseResourcesBitTest);
	addFunctionCase				(commandBuffersTests.get(), "pool_reset_no_flags_res",			"",	resetPoolNoFlagsTest);
	addFunctionCase				(commandBuffersTests.get(), "pool_reset_reuse",					"",	resetPoolReuseTest);
	/* 19.2. Command Buffer Lifetime (5.2 in VK 1.0 Spec) */
	addFunctionCase				(commandBuffersTests.get(), "allocate_single_primary",			"", allocatePrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "allocate_many_primary",			"",	allocateManyPrimaryBuffersTest);
	addFunctionCase				(commandBuffersTests.get(), "allocate_single_secondary",		"", allocateSecondaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "allocate_many_secondary",			"", allocateManySecondaryBuffersTest);
	addFunctionCase				(commandBuffersTests.get(), "execute_small_primary",			"",	executePrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "execute_large_primary",			"",	executeLargePrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "reset_implicit",					"", resetBufferImplicitlyTest);
	addFunctionCase				(commandBuffersTests.get(), "trim_command_pool",				"", trimCommandPoolTest, VK_COMMAND_BUFFER_LEVEL_PRIMARY);
	addFunctionCase				(commandBuffersTests.get(), "trim_command_pool_secondary",		"", trimCommandPoolTest, VK_COMMAND_BUFFER_LEVEL_SECONDARY);
	/* 19.3. Command Buffer Recording (5.3 in VK 1.0 Spec) */
	addFunctionCase				(commandBuffersTests.get(), "record_single_primary",			"",	recordSinglePrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "record_many_primary",				"", recordLargePrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "record_single_secondary",			"",	recordSingleSecondaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "record_many_secondary",			"", recordLargeSecondaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "submit_twice_primary",				"",	submitPrimaryBufferTwiceTest);
	addFunctionCase				(commandBuffersTests.get(), "submit_twice_secondary",			"",	submitSecondaryBufferTwiceTest);
	addFunctionCase				(commandBuffersTests.get(), "record_one_time_submit_primary",	"",	oneTimeSubmitFlagPrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "record_one_time_submit_secondary",	"",	oneTimeSubmitFlagSecondaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "render_pass_continue",				"",	renderPassContinueTest);
	addFunctionCase				(commandBuffersTests.get(), "record_simul_use_primary",			"",	simultaneousUsePrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "record_simul_use_secondary",		"",	simultaneousUseSecondaryBufferTest);
	addFunctionCaseWithPrograms (commandBuffersTests.get(), "record_simul_use_secondary_one_primary", "", genComputeIncrementSource, simultaneousUseSecondaryBufferOnePrimaryBufferTest);
	addFunctionCaseWithPrograms (commandBuffersTests.get(), "record_simul_use_secondary_two_primary", "", genComputeIncrementSource, simultaneousUseSecondaryBufferTwoPrimaryBuffersTest);
	addFunctionCase				(commandBuffersTests.get(), "record_query_precise_w_flag",		"",	recordBufferQueryPreciseWithFlagTest);
	addFunctionCase				(commandBuffersTests.get(), "record_query_imprecise_w_flag",	"",	recordBufferQueryImpreciseWithFlagTest);
	addFunctionCase				(commandBuffersTests.get(), "record_query_imprecise_wo_flag",	"",	recordBufferQueryImpreciseWithoutFlagTest);
	/* 19.4. Command Buffer Submission (5.4 in VK 1.0 Spec) */
	addFunctionCase				(commandBuffersTests.get(), "submit_count_non_zero",			"", submitBufferCountNonZero);
	addFunctionCase				(commandBuffersTests.get(), "submit_count_equal_zero",			"", submitBufferCountEqualZero);
	addFunctionCase				(commandBuffersTests.get(), "submit_wait_single_semaphore",		"", submitBufferWaitSingleSemaphore);
	addFunctionCase				(commandBuffersTests.get(), "submit_wait_many_semaphores",		"", submitBufferWaitManySemaphores);
	addFunctionCase				(commandBuffersTests.get(), "submit_null_fence",				"", submitBufferNullFence);
	/* 19.5. Secondary Command Buffer Execution (5.6 in VK 1.0 Spec) */
	addFunctionCase				(commandBuffersTests.get(), "secondary_execute",				"",	executeSecondaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "secondary_execute_twice",			"",	executeSecondaryBufferTwiceTest);
	/* 19.6. Commands Allowed Inside Command Buffers (? in VK 1.0 Spec) */
	addFunctionCaseWithPrograms (commandBuffersTests.get(), "order_bind_pipeline",				"", genComputeSource, orderBindPipelineTest);

	return commandBuffersTests.release();
}